

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReader.cpp
# Opt level: O0

StepStatus __thiscall
adios2::core::engine::SscReader::BeginStep(SscReader *this,StepMode stepMode,float timeoutSeconds)

{
  StepStatus SVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  element_type *peVar5;
  uint in_ESI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  StepStatus ret;
  ScopedTimer __var260;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int local_110;
  allocator *__val;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50 [36];
  StepStatus local_2c;
  undefined4 local_10;
  uint local_c;
  
  local_10 = in_XMM0_Da;
  local_c = in_ESI;
  if (BeginStep(adios2::StepMode,float)::__var60 == '\0') {
    iVar2 = __cxa_guard_acquire(&BeginStep(adios2::StepMode,float)::__var60);
    if (iVar2 != 0) {
      uVar4 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/ssc/SscReader.cpp"
                                  ,
                                  "virtual StepStatus adios2::core::engine::SscReader::BeginStep(StepMode, const float)"
                                  ,0x3c);
      BeginStep::__var60 = (void *)ps_timer_create_(uVar4);
      __cxa_guard_release(&BeginStep(adios2::StepMode,float)::__var60);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  peVar5 = std::
           __shared_ptr_access<adios2::core::engine::ssc::SscReaderBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<adios2::core::engine::ssc::SscReaderBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d7ed3);
  local_2c = (*peVar5->_vptr_SscReaderBase[2])
                       (local_10,peVar5,(ulong)local_c,(ulong)(*(byte *)(in_RDI + 0x83) & 1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"Engine",&local_51);
  __val = &local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"SscReader",__val);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"BeginStep",&local_a1);
  CurrentStep((SscReader *)0x1d7fa0);
  std::__cxx11::to_string((unsigned_long)__val);
  if (*(int *)(in_RDI + 0xc0) < 10) {
    local_110 = 0;
  }
  else {
    local_110 = adios2::helper::Comm::Rank();
  }
  iVar3 = adios2::helper::Comm::Rank();
  iVar2 = *(int *)(in_RDI + 0xc0);
  adios2::helper::Log(local_50,local_78,local_a0,local_c8,local_110,iVar3,5,iVar2,INFO);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  SVar1 = local_2c;
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_fffffffffffffed4,iVar2));
  return SVar1;
}

Assistant:

StepStatus SscReader::BeginStep(StepMode stepMode, const float timeoutSeconds)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();

    auto ret = m_EngineInstance->BeginStep(stepMode, timeoutSeconds, m_ReaderSelectionsLocked);

    helper::Log("Engine", "SscReader", "BeginStep", std::to_string(CurrentStep()),
                m_Verbosity >= 10 ? m_Comm.Rank() : 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);

    return ret;
}